

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void async_func_free(JSRuntime *rt,JSAsyncFunctionState *s)

{
  JSValue *pJVar1;
  
  close_var_refs(rt,&s->frame);
  pJVar1 = (s->frame).arg_buf;
  if (pJVar1 != (JSValue *)0x0) {
    for (; pJVar1 < (s->frame).cur_sp; pJVar1 = pJVar1 + 1) {
      JS_FreeValueRT(rt,*pJVar1);
    }
    (*(rt->mf).js_free)(&rt->malloc_state,(s->frame).arg_buf);
  }
  JS_FreeValueRT(rt,(s->frame).cur_func);
  JS_FreeValueRT(rt,s->this_val);
  return;
}

Assistant:

static void async_func_free(JSRuntime *rt, JSAsyncFunctionState *s)
{
    JSStackFrame *sf;
    JSValue *sp;

    sf = &s->frame;

    /* close the closure variables. */
    close_var_refs(rt, sf);
    
    if (sf->arg_buf) {
        /* cannot free the function if it is running */
        assert(sf->cur_sp != NULL);
        for(sp = sf->arg_buf; sp < sf->cur_sp; sp++) {
            JS_FreeValueRT(rt, *sp);
        }
        js_free_rt(rt, sf->arg_buf);
    }
    JS_FreeValueRT(rt, sf->cur_func);
    JS_FreeValueRT(rt, s->this_val);
}